

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O3

string * __thiscall
HdlcAnalyzerResults::EscapeByteStr_abi_cxx11_
          (string *__return_storage_ptr__,HdlcAnalyzerResults *this,Frame *frame)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BYTE_ASYNC) &&
     (((byte)frame[0x21] & 1) != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "0x7D-";
    pcVar1 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string HdlcAnalyzerResults::EscapeByteStr( const Frame& frame )
{
    if( ( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BYTE_ASYNC ) && ( frame.mFlags & HDLC_ESCAPED_BYTE ) )
    {
        return string( "0x7D-" );
    }
    else
    {
        return string( "" );
    }
}